

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingFundamentals.cpp
# Opt level: O2

void logDouble<double>(void)

{
  Session *this;
  atomic<unsigned_long> eventSourceId;
  SessionWriter *pSVar1;
  __atomic_base<unsigned_long> _Var2;
  nanoseconds clock;
  double f;
  allocator local_ef;
  allocator local_ee;
  allocator local_ed;
  allocator local_ec;
  allocator local_eb;
  char local_ea [2];
  double local_e8;
  undefined1 local_e0 [48];
  string local_b0 [32];
  string local_90 [32];
  uint64_t local_70;
  string local_68 [32];
  string local_48 [32];
  
  local_e8 = 1234234.0234242;
  pSVar1 = binlog::default_thread_local_writer();
  if ((pSVar1->_session->_minSeverity)._M_i < 0x81) {
    if (logDouble<double>::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      pSVar1 = binlog::default_thread_local_writer();
      this = pSVar1->_session;
      local_e0._0_8_ = 0;
      local_e0._8_2_ = info;
      std::__cxx11::string::string((string *)(local_e0 + 0x10),"main",&local_eb);
      std::__cxx11::string::string(local_b0,"logDouble",&local_ec);
      std::__cxx11::string::string
                (local_90,
                 "/workspace/llm4binary/github/license_c_cmakelists/morganstanley[P]binlog/test/integration/LoggingFundamentals.cpp"
                 ,&local_ed);
      local_70 = 0x1c;
      std::__cxx11::string::string(local_68,"{}",&local_ee);
      local_ea[0] = 'd';
      local_ea[1] = '\0';
      std::__cxx11::string::string(local_48,local_ea,&local_ef);
      _Var2._M_i = binlog::Session::addEventSource(this,(EventSource *)local_e0);
      binlog::EventSource::~EventSource((EventSource *)local_e0);
      LOCK();
      UNLOCK();
      logDouble<double>::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var2._M_i;
    }
    eventSourceId.super___atomic_base<unsigned_long>._M_i =
         logDouble<double>::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    pSVar1 = binlog::default_thread_local_writer();
    clock = binlog::clockSinceEpoch();
    binlog::SessionWriter::addEvent<double&>
              (pSVar1,(uint64_t)eventSourceId.super___atomic_base<unsigned_long>._M_i,clock.__r,
               &local_e8);
  }
  return;
}

Assistant:

void logDouble()
{
  T f = 1234234.0234242;
  BINLOG_INFO("{}", f);
}